

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jessilib::
join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,jessilib *this,basic_string_view<char,_std::char_traits<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string_view<char,_std::char_traits<char>_> *args_3,
          basic_string_view<char,_std::char_traits<char>_> *args_4,
          basic_string_view<char,_std::char_traits<char>_> *args_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
          basic_string_view<char,_std::char_traits<char>_> *args_7)

{
  size_t __res;
  basic_string_view<char,_std::char_traits<char>_> *args_local_4;
  basic_string_view<char,_std::char_traits<char>_> *args_local_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __res = impl_join::
          join_sizes<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                     args_1,(basic_string_view<char,_std::char_traits<char>_> *)args_2,args_3,args_4
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_5,
                     (basic_string_view<char,_std::char_traits<char>_> *)args_6);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,__res);
  impl_join::
  join_append<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>>
            (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,args_1,
             (basic_string_view<char,_std::char_traits<char>_> *)args_2,args_3,args_4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_5,
             (basic_string_view<char,_std::char_traits<char>_> *)args_6);
  return __return_storage_ptr__;
}

Assistant:

OutT join(ArgsT&&... args) {
	OutT result;
	result.reserve(impl_join::join_sizes(args...));
	impl_join::join_append<OutT, ArgsT...>(result, std::forward<ArgsT>(args)...);
	return result;
}